

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O2

Error gerr::Make<fake::ErrArgumentZero,fake::ErrArgumentZero::__PrivateStruct__>
                (__PrivateStruct__ *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Error EVar1;
  shared_ptr<fake::ErrArgumentZero> p;
  __PrivateStruct__ local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::make_shared<fake::ErrArgumentZero,fake::ErrArgumentZero::__PrivateStruct__>(local_20);
  std::static_pointer_cast<gerr::details::IError,fake::ErrArgumentZero>
            ((shared_ptr<fake::ErrArgumentZero> *)args);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)args;
  return (Error)EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Error Make(Args&&... args) {
  auto p = std::make_shared<ErrType>(std::forward<Args>(args)...);
  return std::static_pointer_cast<details::IError>(p);
}